

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>
               (int *dummy)

{
  bool OK;
  anon_class_8_1_3fcf629a local_50;
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1> local_48;
  
  OK = true;
  local_48.data._0_3_ = 0;
  local_48._19_8_ = 0;
  local_48.ptr = (void *)0x0;
  local_48.allocptr._0_3_ = 0;
  local_48.allocptr._3_5_ = 0;
  local_50.OK = (bool *)&local_48;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_1_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x94,(anon_class_8_1_4513f532 *)&local_50,
             "!optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_ptr(&local_48);
  OK = false;
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_2_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x96,&local_50,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_ptr(&local_48);
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_3_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x98,&local_50,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::init
            (&local_48,(EVP_PKEY_CTX *)dummy);
  local_50.OK = (bool *)&local_48;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_4_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0x9e,(anon_class_8_1_4513f532 *)&local_50,
             "!optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_ptr(&local_48);
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_5_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa0,&local_50,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_ptr(&local_48);
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_6_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa2,&local_50,"OK");
  local_48.isZombie = true;
  local_50.OK = (bool *)&local_48;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_7_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa5,(anon_class_8_1_4513f532 *)&local_50,
             "optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_ptr(&local_48);
  OK = false;
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_8_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa7,&local_50,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_ptr(&local_48);
  OK = false;
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_9_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xa9,&local_50,"OK");
  local_50.OK = (bool *)&local_48;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_10_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xad,(anon_class_8_1_4513f532 *)&local_50,
             "optimizedPtrWithZombiePproperty.is_zombie()");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_allocated_ptr(&local_48);
  OK = false;
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_11_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xaf,&local_50,"OK");
  nodecpp::platform::ptrwithdatastructsdefs::
  generic_allocated_ptr_and_ptr_and_data_and_flags_<2UL,_32,_1>::get_dereferencable_allocated_ptr
            (&local_48);
  OK = false;
  local_50.OK = &OK;
  nodecpp::assert::
  nodecpp_assert<0ul,(nodecpp::assert::AssertLevel)0,testPtrStructsWithZombieProperty_<nodecpp::platform::ptrwithdatastructsdefs::generic_allocated_ptr_and_ptr_and_data_and_flags_<2ul,32,1>,true>(int*)::_lambda()_12_>
            ("/workspace/llm4binary/github/license_all_cmakelists_25/node-dot-cpp[P]nodecpp-foundation/test/main.cpp"
             ,0xb1,&local_50,"OK");
  return;
}

Assistant:

void testPtrStructsWithZombieProperty_(int* dummy)
{
	bool OK = true;
	TestStructT optimizedPtrWithZombiePproperty;

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init();
	else
		optimizedPtrWithZombiePproperty.init(nullptr);

	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
		optimizedPtrWithZombiePproperty.init(dummy, dummy, 17);
	else
		optimizedPtrWithZombiePproperty.init(dummy);
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, !optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_ptr(); } catch ( ... ) { OK = false; }
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	optimizedPtrWithZombiePproperty.set_zombie();
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
	try { optimizedPtrWithZombiePproperty.get_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	try { optimizedPtrWithZombiePproperty.get_dereferencable_ptr(); OK = false; } catch ( ... ) {}
	NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );

	if constexpr( secondPtr )
	{
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, optimizedPtrWithZombiePproperty.is_zombie() );
		try { optimizedPtrWithZombiePproperty.get_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
		try { optimizedPtrWithZombiePproperty.get_dereferencable_allocated_ptr(); OK = false; } catch ( ... ) {}
		NODECPP_ASSERT( nodecpp::foundation::module_id, nodecpp::assert::AssertLevel::critical, OK );
	}
}